

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O0

void __thiscall
FIX::SocketConnection::SocketConnection
          (SocketConnection *this,socket_handle s,Sessions *sessions,SocketMonitor *pMonitor)

{
  int iVar1;
  fd_set *__arr;
  uint __i;
  SocketMonitor *pMonitor_local;
  Sessions *sessions_local;
  socket_handle s_local;
  SocketConnection *this_local;
  
  Responder::Responder(&this->super_Responder);
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__SocketConnection_0030d2f8;
  this->m_socket = s;
  Parser::Parser(&this->m_parser);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::deque(&this->m_sendQueue);
  this->m_sendLength = 0;
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            (&this->m_sessions,sessions);
  this->m_pSession = (Session *)0x0;
  this->m_pMonitor = pMonitor;
  Mutex::Mutex(&this->m_mutex);
  for (__arr._0_4_ = 0; (uint)__arr < 0x10; __arr._0_4_ = (uint)__arr + 1) {
    (this->m_fds).fds_bits[(uint)__arr] = 0;
  }
  iVar1 = this->m_socket / 0x40;
  (this->m_fds).fds_bits[iVar1] =
       1L << ((byte)((long)this->m_socket % 0x40) & 0x3f) | (this->m_fds).fds_bits[iVar1];
  return;
}

Assistant:

SocketConnection::SocketConnection(socket_handle s, Sessions sessions,
                                    SocketMonitor* pMonitor )
: m_socket( s ), m_sendLength( 0 ),
  m_sessions(sessions), m_pSession( 0 ), m_pMonitor( pMonitor )
{
  FD_ZERO( &m_fds );
  FD_SET( m_socket, &m_fds );
}